

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

Own<kj::_::FiberStack,_std::nullptr_t> __thiscall kj::FiberPool::Impl::takeStack(Impl *this)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  size_t sVar3;
  long *plVar4;
  _func_int *p_Var5;
  FiberStack *this_00;
  FiberStack *extraout_RDX;
  FiberStack *extraout_RDX_00;
  FiberStack *extraout_RDX_01;
  FiberStack *pFVar6;
  _func_int **in_RSI;
  Own<kj::_::FiberStack,_std::nullptr_t> OVar7;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  lookupCoreLocalFreelist((Impl *)&stack0xffffffffffffffc0);
  plVar4 = (long *)CONCAT71(uStack_3f,local_40);
  if (plVar4 == (long *)0x0) {
LAB_0045c2bc:
    local_40 = 0;
    kj::_::Mutex::lock((Mutex *)(in_RSI + 3));
    p_Var1 = in_RSI[8];
    p_Var2 = in_RSI[0xc];
    if (p_Var2 != p_Var1) {
      p_Var5 = p_Var2;
      if (p_Var2 == in_RSI[0xd]) {
        p_Var5 = (_func_int *)(*(long *)(in_RSI[0xf] + -8) + 0x200);
      }
      sVar3 = *(size_t *)(p_Var5 + -8);
      std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>::pop_back
                ((deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_> *)(in_RSI + 6));
      (this->super_Disposer)._vptr_Disposer = in_RSI;
      this->stackSize = sVar3;
    }
    kj::_::Mutex::unlock((Mutex *)(in_RSI + 3),EXCLUSIVE,(Waiter *)0x0);
    pFVar6 = extraout_RDX_00;
    if (p_Var2 != p_Var1) goto LAB_0045c33a;
    this_00 = (FiberStack *)operator_new(0x20);
    kj::_::FiberStack::FiberStack(this_00,(size_t)in_RSI[1]);
    pFVar6 = extraout_RDX_01;
  }
  else {
    LOCK();
    this_00 = (FiberStack *)*plVar4;
    *plVar4 = 0;
    UNLOCK();
    pFVar6 = extraout_RDX;
    if (this_00 == (FiberStack *)0x0) {
      LOCK();
      this_00 = (FiberStack *)plVar4[1];
      plVar4[1] = 0;
      UNLOCK();
      if (this_00 == (FiberStack *)0x0) goto LAB_0045c2bc;
    }
  }
  (this->super_Disposer)._vptr_Disposer = in_RSI;
  this->stackSize = (size_t)this_00;
LAB_0045c33a:
  OVar7.ptr = pFVar6;
  OVar7.disposer = &this->super_Disposer;
  return OVar7;
}

Assistant:

Own<_::FiberStack> takeStack() const {
    // Get a stack from the pool. The disposer on the returned Own pointer will return the stack
    // to the pool, provided that reset() has been called to indicate that the stack is not in
    // a weird state.

#if USE_CORE_LOCAL_FREELISTS
    KJ_IF_SOME(core, lookupCoreLocalFreelist()) {
      for (auto& stackPtr: core.stacks) {
        _::FiberStack* result = __atomic_exchange_n(&stackPtr, nullptr, __ATOMIC_ACQUIRE);
        if (result != nullptr) {
          // Found a stack in this slot!
          return { result, *this };
        }
      }
      // No stacks found, fall back to global freelist.
    }
#endif

    {
      auto lock = freelist.lockExclusive();
      if (!lock->empty()) {
        _::FiberStack* result = lock->back();
        lock->pop_back();
        return { result, *this };
      }
    }

    _::FiberStack* result = new _::FiberStack(stackSize);
    return { result, *this };
  }